

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O2

void dirSAVEHOB(void)

{
  aint start;
  bool bVar1;
  int iVar2;
  EStatus type;
  char *message;
  aint val;
  string fnaamh;
  path fnaam;
  string local_48;
  
  if ((DeviceID == (char *)0x0) || (pass != 3)) {
    if (DeviceID == (char *)0x0) {
      Error("SAVEHOB only allowed in real device emulation mode (See DEVICE)",(char *)0x0,PASS3);
    }
    SkipToEol(&lp);
    return;
  }
  GetOutputFileName_abi_cxx11_(&fnaam,&lp);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fnaamh,"",(allocator<char> *)&local_48);
  bVar1 = anyComma(&lp);
  type = PASS3;
  message = "[SAVEHOB] Syntax error. No parameters";
  if (bVar1) {
    bVar1 = anyComma(&lp);
    if (!bVar1) {
      GetDelimitedString_abi_cxx11_(&local_48,&lp);
      std::__cxx11::string::operator=((string *)&fnaamh,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      if (fnaamh._M_string_length == 0) {
LAB_0010d218:
        message = "[SAVEHOB] Syntax error";
      }
      else {
        bVar1 = anyComma(&lp);
        if (bVar1) {
          bVar1 = anyComma(&lp);
          if (!bVar1) {
            iVar2 = ParseExpression(&lp,&val);
            start = val;
            if (iVar2 == 0) goto LAB_0010d218;
            if (val < 0x4000) {
              message = "[SAVEHOB] Values less than 4000h are not allowed";
            }
            else if ((uint)val < 0x10000) {
              bVar1 = anyComma(&lp);
              if (bVar1) {
                iVar2 = ParseExpression(&lp,&val);
                if (iVar2 == 0) goto LAB_0010d218;
                if (val < 0) {
                  message = "[SAVEHOB] Negative values are not allowed";
                  goto LAB_0010d21b;
                }
              }
              else {
                val = -1;
              }
              iVar2 = SaveHobeta(&fnaam,fnaamh._M_dataplus._M_p,start,val);
              if (iVar2 != 0) goto LAB_0010d22f;
              type = IF_FIRST;
              message = "[SAVEHOB] Error writing file (Disk full?)";
            }
            else {
              message = "[SAVEHOB] Values more than FFFFh are not allowed";
            }
          }
        }
      }
    }
  }
LAB_0010d21b:
  Error(message,bp,type);
LAB_0010d22f:
  std::__cxx11::string::~string((string *)&fnaamh);
  std::filesystem::__cxx11::path::~path(&fnaam);
  return;
}

Assistant:

static void dirSAVEHOB() {
	if (!DeviceID || pass != LASTPASS) {
		if (!DeviceID) Error("SAVEHOB only allowed in real device emulation mode (See DEVICE)");
		SkipToEol(lp);
		return;
	}
	aint val;
	int start = -1,length = -1;
	bool exec = true;

	const std::filesystem::path fnaam = GetOutputFileName(lp);
	std::string fnaamh {""};
	if (anyComma(lp)) {
		if (!anyComma(lp)) {
			fnaamh = GetDelimitedString(lp);
			if (fnaamh.empty()) {
				Error("[SAVEHOB] Syntax error", bp, PASS3); return;
			}
		} else {
		  	Error("[SAVEHOB] Syntax error. No parameters", bp, PASS3); return;
		}
	} else {
		Error("[SAVEHOB] Syntax error. No parameters", bp, PASS3); return; //is this ok?
	}

	if (anyComma(lp)) {
		if (!anyComma(lp)) {
			if (!ParseExpression(lp, val)) {
				Error("[SAVEHOB] Syntax error", bp, PASS3); return;
			}
			if (val < 0x4000) {
				Error("[SAVEHOB] Values less than 4000h are not allowed", bp, PASS3); return;
			} else if (val > 0xFFFF) {
			  	Error("[SAVEHOB] Values more than FFFFh are not allowed", bp, PASS3); return;
			}
			start = val;
		} else {
		  	Error("[SAVEHOB] Syntax error. No parameters", bp, PASS3); return;
		}
		if (anyComma(lp)) {
			if (!ParseExpression(lp, val)) {
				Error("[SAVEHOB] Syntax error", bp, PASS3); return;
			}
			if (val < 0) {
				Error("[SAVEHOB] Negative values are not allowed", bp, PASS3); return;
			}
			length = val;
		}
	} else {
		Error("[SAVEHOB] Syntax error. No parameters", bp, PASS3); return;
	}
	if (exec && !SaveHobeta(fnaam, fnaamh.c_str(), start, length)) {
		Error("[SAVEHOB] Error writing file (Disk full?)", bp, IF_FIRST); return;
	}
}